

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourceCacheGL::CachedResourceView::Set
          (CachedResourceView *this,RefCntAutoPtr<Diligent::TextureViewGLImpl> *pTexView,
          bool SetSampler)

{
  SamplerGLImpl *pSVar1;
  TextureBaseGL *pSrcPtr;
  
  if (pTexView->m_pObject == (TextureViewGLImpl *)0x0) {
    pSrcPtr = (TextureBaseGL *)0x0;
  }
  else {
    pSrcPtr = (TextureBaseGL *)
              (pTexView->m_pObject->super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pTexture;
    if (pSrcPtr != (TextureBaseGL *)0x0) {
      CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>((ITexture *)pSrcPtr);
    }
  }
  this->pTexture = pSrcPtr;
  if (SetSampler && pTexView->m_pObject != (TextureViewGLImpl *)0x0) {
    pSVar1 = RefCntAutoPtr<Diligent::ISampler>::RawPtr<Diligent::SamplerGLImpl>
                       (&(pTexView->m_pObject->super_TextureViewBase<Diligent::EngineGLImplTraits>).
                         m_pSampler);
    (this->field_2).pSampler = pSVar1;
  }
  RefCntAutoPtr<Diligent::IDeviceObject>::operator=(&this->pView,pTexView);
  return;
}

Assistant:

void Set(RefCntAutoPtr<TextureViewGLImpl>&& pTexView, bool SetSampler)
        {
            // Do not null out pSampler as it could've been initialized by PipelineResourceSignatureGLImpl::InitSRBResourceCache!
            // pSampler = nullptr;

            // Avoid unnecessary virtual call
            pTexture = pTexView ? pTexView->GetTexture<TextureBaseGL>() : nullptr;
            if (pTexView && SetSampler)
            {
                pSampler = pTexView->GetSampler<SamplerGLImpl>();
            }

            pView = std::move(pTexView);
        }